

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.hpp
# Opt level: O0

void __thiscall
OpenMD::Element::Element
          (Element *this,int num,char *sym,RealType ARENeg,RealType rcov,RealType rvdw,int maxbo,
          RealType mass,RealType elNeg,RealType ionize,RealType elAffin,RealType red,RealType green,
          RealType blue,string *name)

{
  undefined4 in_ECX;
  ulong in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  string *in_R8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  
  *in_RDI = in_ESI;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::string((string *)(in_RDI + 10),in_R8);
  *(undefined8 *)(in_RDI + 0x12) = in_XMM1_Qa;
  *(undefined8 *)(in_RDI + 0x14) = in_XMM2_Qa;
  *(undefined8 *)(in_RDI + 0x16) = in_XMM3_Qa;
  *(undefined8 *)(in_RDI + 0x18) = in_XMM4_Qa;
  *(undefined8 *)(in_RDI + 0x1a) = in_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x1c) = in_XMM5_Qa;
  *(undefined8 *)(in_RDI + 0x1e) = in_XMM6_Qa;
  *(undefined8 *)(in_RDI + 0x20) = in_XMM7_Qa;
  *(undefined8 *)(in_RDI + 0x22) = in_stack_00000008;
  *(undefined8 *)(in_RDI + 0x24) = in_stack_00000010;
  in_RDI[0x26] = in_ECX;
  std::__cxx11::string::assign((char *)(in_RDI + 2),in_RDX);
  return;
}

Assistant:

Element(int num, const char* sym, RealType ARENeg, RealType rcov,
            RealType rvdw, int maxbo, RealType mass, RealType elNeg,
            RealType ionize, RealType elAffin, RealType red, RealType green,
            RealType blue, std::string name) :
        num_(num),
        name_(name), Rcov_(rcov), Rvdw_(rvdw), mass_(mass), elNeg_(elNeg),
        ARENeg_(ARENeg), ionize_(ionize), elAffinity_(elAffin), red_(red),
        green_(green), blue_(blue), maxbonds_(maxbo) {
      symbol_.assign(sym, 3);
    }